

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.c
# Opt level: O1

char * val_type(byte typeID)

{
  byte bVar1;
  double *pdVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  char *extraout_RAX;
  vec *instructions;
  int in_ESI;
  undefined7 in_register_00000039;
  byte *pbVar4;
  char *pcVar5;
  ulong uVar6;
  double dVar7;
  
  pbVar4 = (byte *)CONCAT71(in_register_00000039,typeID);
  if ('{' < (char)typeID) {
    return &DAT_00109738 + *(int *)(&DAT_00109738 + (ulong)(byte)(typeID + 0x84) * 4);
  }
  val_type_cold_1();
  iVar3 = printf("%s ",opNames[*pbVar4]);
  pdVar2 = *(double **)(pbVar4 + 8);
  if (pdVar2 == (double *)0x0) {
LAB_00103ba8:
    iVar3 = putchar(10);
    return (char *)CONCAT44(extraout_var_02,iVar3);
  }
  bVar1 = *pbVar4;
  if (bVar1 < 0x20) {
    switch(bVar1) {
    case 2:
    case 3:
      goto switchD_00103ac7_caseD_2;
    case 4:
      switch(*(float *)pdVar2) {
      case -NAN:
        pcVar5 = "f64";
        break;
      case -NAN:
        pcVar5 = "f32";
        break;
      case -NAN:
        pcVar5 = "i64";
        break;
      case -NAN:
        pcVar5 = "i32";
        break;
      default:
        if (*(float *)pdVar2 == -NAN) {
          putchar(10);
        }
        goto LAB_00103c9d;
      }
      puts(pcVar5);
LAB_00103c9d:
      print_instructions((vec *)(pdVar2 + 1),in_ESI + 2,true);
      instructions = (vec *)(pdVar2 + 0xb);
      goto LAB_00103cb4;
    default:
switchD_00103ac7_caseD_5:
      if ((byte)(bVar1 - 0x28) < 0x17) {
        iVar3 = printf("align=%u offset=%lu\n",(ulong)(uint)*(float *)pdVar2,pdVar2[1]);
        return (char *)CONCAT44(extraout_var_05,iVar3);
      }
      return (char *)CONCAT71((int7)(CONCAT44(extraout_var,iVar3) >> 8),bVar1 - 0x28);
    case 0xc:
    case 0xd:
    case 0x10:
switchD_00103ac7_caseD_c:
      uVar6 = (ulong)(uint)*(float *)pdVar2;
      pcVar5 = "%u\n";
      goto LAB_00103ad2;
    case 0xe:
      if (*(float *)((long)pdVar2 + 4) != 0.0) {
        uVar6 = 0;
        do {
          printf("%u ",(ulong)*(uint *)((long)pdVar2[1] + uVar6 * 4));
          uVar6 = uVar6 + 1;
        } while (uVar6 < (uint)*(float *)((long)pdVar2 + 4));
      }
      printf("%u(default)",(ulong)(uint)*(float *)pdVar2);
      goto LAB_00103ba8;
    case 0x11:
      uVar6 = (ulong)(uint)*(float *)pdVar2;
      pcVar5 = "index:%u table:0x0\n";
      goto LAB_00103ad2;
    }
  }
  switch(bVar1) {
  case 0x3f:
  case 0x40:
    iVar3 = puts("0x0");
    return (char *)CONCAT44(extraout_var_01,iVar3);
  case 0x41:
    uVar6 = (ulong)(uint)*(float *)pdVar2;
    break;
  case 0x42:
    iVar3 = printf("%ld\n",*pdVar2);
    return (char *)CONCAT44(extraout_var_03,iVar3);
  case 0x43:
    dVar7 = (double)*(float *)pdVar2;
    goto LAB_00103bef;
  case 0x44:
    dVar7 = *pdVar2;
LAB_00103bef:
    iVar3 = printf("%.2f\n",dVar7);
    return (char *)CONCAT44(extraout_var_04,iVar3);
  default:
    if (bVar1 - 0x20 < 5) goto switchD_00103ac7_caseD_c;
    if (bVar1 != 0xfc) goto switchD_00103ac7_caseD_5;
    uVar6 = (ulong)*(byte *)pdVar2;
  }
  pcVar5 = "%d\n";
LAB_00103ad2:
  iVar3 = printf(pcVar5,uVar6);
  return (char *)CONCAT44(extraout_var_00,iVar3);
switchD_00103ac7_caseD_2:
  switch(*(float *)pdVar2) {
  case -NAN:
    pcVar5 = "f64";
    break;
  case -NAN:
    pcVar5 = "f32";
    break;
  case -NAN:
    pcVar5 = "i64";
    break;
  case -NAN:
    pcVar5 = "i32";
    break;
  default:
    if (*(float *)pdVar2 == -NAN) {
      putchar(10);
    }
    goto LAB_00103c76;
  }
  puts(pcVar5);
LAB_00103c76:
  instructions = (vec *)(pdVar2 + 1);
LAB_00103cb4:
  print_instructions(instructions,in_ESI + 2,true);
  return extraout_RAX;
}

Assistant:

const char *val_type(byte typeID) {
    switch (typeID) {
        case I32:
            return "i32";
        case I64:
            return "i64";
        case F32:
            return "f32";
        case F64:
            return "f64";
        default:
            errorExit("\nwrong typeID\n");
    }
}